

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::Tags::Tag::ExpandSimpleTagsArray(Tag *this)

{
  int iVar1;
  uint uVar2;
  SimpleTag *pSVar3;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  SimpleTag *pSVar7;
  int iVar8;
  bool bVar9;
  
  iVar1 = this->m_simple_tags_size;
  uVar2 = this->m_simple_tags_count;
  bVar9 = true;
  if (iVar1 <= (int)uVar2) {
    iVar8 = 1;
    if (iVar1 != 0) {
      iVar8 = iVar1 * 2;
    }
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar8) {
      uVar6 = (long)iVar8 << 4 | 8;
    }
    plVar4 = (long *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    if (plVar4 == (long *)0x0) {
      pSVar7 = (SimpleTag *)0x0;
    }
    else {
      *plVar4 = (long)iVar8;
      pSVar7 = (SimpleTag *)(plVar4 + 1);
    }
    bVar9 = pSVar7 != (SimpleTag *)0x0;
    if (bVar9) {
      if (0 < (int)uVar2) {
        pSVar3 = this->m_simple_tags;
        lVar5 = 0;
        do {
          *(undefined8 *)((long)&pSVar7->m_tag_name + lVar5) =
               *(undefined8 *)((long)&pSVar3->m_tag_name + lVar5);
          *(undefined8 *)((long)&pSVar7->m_tag_string + lVar5) =
               *(undefined8 *)((long)&pSVar3->m_tag_string + lVar5);
          lVar5 = lVar5 + 0x10;
        } while ((ulong)uVar2 << 4 != lVar5);
      }
      if (this->m_simple_tags != (SimpleTag *)0x0) {
        operator_delete__(&this->m_simple_tags[-1].m_tag_string);
      }
      this->m_simple_tags = pSVar7;
      this->m_simple_tags_size = iVar8;
    }
  }
  return bVar9;
}

Assistant:

bool Tags::Tag::ExpandSimpleTagsArray() {
  if (m_simple_tags_size > m_simple_tags_count)
    return true;  // nothing else to do

  const int size = (m_simple_tags_size == 0) ? 1 : 2 * m_simple_tags_size;

  SimpleTag* const displays = new (std::nothrow) SimpleTag[size];

  if (displays == NULL)
    return false;

  for (int idx = 0; idx < m_simple_tags_count; ++idx) {
    m_simple_tags[idx].ShallowCopy(displays[idx]);
  }

  delete[] m_simple_tags;
  m_simple_tags = displays;

  m_simple_tags_size = size;
  return true;
}